

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O3

void __thiscall
Imf_3_2::DwaCompressor::relevantChannelRules
          (DwaCompressor *this,
          vector<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
          *rules)

{
  bool bVar1;
  long lVar2;
  pointer pCVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  suffixes;
  string suffix;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  vector<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
  *local_78;
  value_type local_70;
  long *local_50 [2];
  long local_40 [2];
  
  local_78 = rules;
  std::
  vector<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>::
  _M_erase_at_end(rules,(rules->
                        super__Vector_base<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
                        )._M_impl.super__Vector_impl_data._M_start);
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar3 = (this->_channelData).
           super__Vector_base<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_channelData).
      super__Vector_base<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
      ._M_impl.super__Vector_impl_data._M_finish != pCVar3) {
    lVar5 = 8;
    uVar6 = 0;
    do {
      lVar2 = *(long *)((long)pCVar3->planarUncRle + lVar5 + -0x58);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,lVar2,
                 *(long *)((long)pCVar3->planarUncRle + lVar5 + -0x50) + lVar2);
      lVar2 = std::__cxx11::string::rfind((char)&local_70,0x2e);
      if (lVar2 != -1) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)&local_70);
        std::__cxx11::string::operator=((string *)&local_70,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_98,&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      uVar6 = uVar6 + 1;
      pCVar3 = (this->_channelData).
               super__Vector_base<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = lVar5 + 0x98;
    } while (uVar6 < (ulong)(((long)(this->_channelData).
                                    super__Vector_base<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3 >> 3)
                            * -0x79435e50d79435e5));
  }
  if ((this->_channelRules).
      super__Vector_base<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->_channelRules).
      super__Vector_base<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar6 = 0;
    do {
      pCVar3 = (this->_channelData).
               super__Vector_base<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((this->_channelData).
          super__Vector_base<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
          ._M_impl.super__Vector_impl_data._M_finish != pCVar3) {
        lVar2 = 0x2c;
        lVar5 = 0;
        uVar4 = 0;
        do {
          bVar1 = Classifier::match((this->_channelRules).
                                    super__Vector_base<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar6,
                                    (string *)
                                    ((long)&((local_98.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            _M_dataplus)._M_p + lVar5),
                                    *(PixelType *)((long)pCVar3->planarUncRle + lVar2 + -0x50));
          if (bVar1) {
            std::
            vector<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
            ::push_back(local_78,(this->_channelRules).
                                 super__Vector_base<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar6);
            break;
          }
          uVar4 = uVar4 + 1;
          pCVar3 = (this->_channelData).
                   super__Vector_base<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar5 = lVar5 + 0x20;
          lVar2 = lVar2 + 0x98;
        } while (uVar4 < (ulong)(((long)(this->_channelData).
                                        super__Vector_base<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3 >>
                                 3) * -0x79435e50d79435e5));
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)(((long)(this->_channelRules).
                                    super__Vector_base<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->_channelRules).
                                    super__Vector_base<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4) *
                            -0x5555555555555555));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  return;
}

Assistant:

void
DwaCompressor::relevantChannelRules (std::vector<Classifier>& rules) const
{
    rules.clear ();

    std::vector<std::string> suffixes;

    for (size_t cd = 0; cd < _channelData.size (); ++cd)
    {
        std::string suffix  = _channelData[cd].name;
        size_t      lastDot = suffix.find_last_of ('.');

        if (lastDot != std::string::npos)
            suffix = suffix.substr (lastDot + 1, std::string::npos);

        suffixes.push_back (suffix);
    }

    for (size_t i = 0; i < _channelRules.size (); ++i)
    {
        for (size_t cd = 0; cd < _channelData.size (); ++cd)
        {
            if (_channelRules[i].match (suffixes[cd], _channelData[cd].type))
            {
                rules.push_back (_channelRules[i]);
                break;
            }
        }
    }
}